

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O0

int x509_name_ex_new(ASN1_VALUE **val,ASN1_ITEM *it)

{
  ASN1_VALUE *orig_ptr;
  stack_st_X509_NAME_ENTRY *psVar1;
  BUF_MEM *pBVar2;
  X509_NAME *ret;
  ASN1_ITEM *it_local;
  ASN1_VALUE **val_local;
  
  orig_ptr = (ASN1_VALUE *)OPENSSL_malloc(0x28);
  if (orig_ptr != (ASN1_VALUE *)0x0) {
    psVar1 = sk_X509_NAME_ENTRY_new_null();
    *(stack_st_X509_NAME_ENTRY **)orig_ptr = psVar1;
    if (psVar1 != (stack_st_X509_NAME_ENTRY *)0x0) {
      pBVar2 = BUF_MEM_new();
      *(BUF_MEM **)(orig_ptr + 0x10) = pBVar2;
      if (pBVar2 != (BUF_MEM *)0x0) {
        *(long *)(orig_ptr + 0x18) = 0;
        *(undefined4 *)(orig_ptr + 0x20) = 0;
        *(undefined4 *)(orig_ptr + 8) = 1;
        *val = orig_ptr;
        return 1;
      }
    }
  }
  if (orig_ptr != (ASN1_VALUE *)0x0) {
    if (*(long *)orig_ptr != 0) {
      sk_X509_NAME_ENTRY_free(*(stack_st_X509_NAME_ENTRY **)orig_ptr);
    }
    OPENSSL_free(orig_ptr);
  }
  return 0;
}

Assistant:

static int x509_name_ex_new(ASN1_VALUE **val, const ASN1_ITEM *it) {
  X509_NAME *ret = NULL;
  ret = reinterpret_cast<X509_NAME *>(OPENSSL_malloc(sizeof(X509_NAME)));
  if (!ret) {
    goto memerr;
  }
  if ((ret->entries = sk_X509_NAME_ENTRY_new_null()) == NULL) {
    goto memerr;
  }
  if ((ret->bytes = BUF_MEM_new()) == NULL) {
    goto memerr;
  }
  ret->canon_enc = NULL;
  ret->canon_enclen = 0;
  ret->modified = 1;
  *val = (ASN1_VALUE *)ret;
  return 1;

memerr:
  if (ret) {
    if (ret->entries) {
      sk_X509_NAME_ENTRY_free(ret->entries);
    }
    OPENSSL_free(ret);
  }
  return 0;
}